

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleNamespace.cpp
# Opt level: O0

void __thiscall
Js::ModuleNamespace::AddUnambiguousNonLocalExport
          (ModuleNamespace *this,PropertyId propertyId,ModuleNameRecord *nonLocalExportNameRecord)

{
  ScriptContext *this_00;
  BaseDictionary<int,_Js::ModuleNameRecord,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  **ppBVar1;
  Recycler *pRVar2;
  BaseDictionary<int,_Js::ModuleNameRecord,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *pBVar3;
  TrackAllocData local_50;
  Recycler *local_28;
  Recycler *recycler;
  ModuleNameRecord *nonLocalExportNameRecord_local;
  ModuleNamespace *pMStack_10;
  PropertyId propertyId_local;
  ModuleNamespace *this_local;
  
  recycler = (Recycler *)nonLocalExportNameRecord;
  nonLocalExportNameRecord_local._4_4_ = propertyId;
  pMStack_10 = this;
  this_00 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  local_28 = ScriptContext::GetRecycler(this_00);
  ppBVar1 = Memory::WriteBarrierPtr::operator_cast_to_BaseDictionary__
                      ((WriteBarrierPtr *)&this->unambiguousNonLocalExports);
  pRVar2 = local_28;
  if (*ppBVar1 ==
      (BaseDictionary<int,_Js::ModuleNameRecord,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
       *)0x0) {
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_50,
               (type_info *)
               &JsUtil::
                BaseDictionary<int,Js::ModuleNameRecord,Memory::RecyclerLeafAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                ::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ModuleNamespace.cpp"
               ,0x92);
    pRVar2 = Memory::Recycler::TrackAllocInfo(pRVar2,&local_50);
    pBVar3 = (BaseDictionary<int,_Js::ModuleNameRecord,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              *)new<Memory::Recycler>(0x38,pRVar2,0x43c4b0);
    JsUtil::
    BaseDictionary<int,_Js::ModuleNameRecord,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::BaseDictionary(pBVar3,local_28,4);
    Memory::
    WriteBarrierPtr<JsUtil::BaseDictionary<int,_Js::ModuleNameRecord,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
    ::operator=(&this->unambiguousNonLocalExports,pBVar3);
  }
  pBVar3 = Memory::
           WriteBarrierPtr<JsUtil::BaseDictionary<int,_Js::ModuleNameRecord,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
           ::operator->(&this->unambiguousNonLocalExports);
  JsUtil::
  BaseDictionary<int,_Js::ModuleNameRecord,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::AddNew(pBVar3,(int *)((long)&nonLocalExportNameRecord_local + 4),(ModuleNameRecord *)recycler);
  return;
}

Assistant:

void ModuleNamespace::AddUnambiguousNonLocalExport(PropertyId propertyId, ModuleNameRecord* nonLocalExportNameRecord)
    {
        Recycler* recycler = GetScriptContext()->GetRecycler();
        if (unambiguousNonLocalExports == nullptr)
        {
            unambiguousNonLocalExports = RecyclerNew(recycler, UnambiguousExportMap, recycler, 4);
        }
        // keep a local copy of the module/
        unambiguousNonLocalExports->AddNew(propertyId, *nonLocalExportNameRecord);
    }